

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

_Bool X86_lockrep(MCInst *MI,SStream *O)

{
  uint8_t uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  _Bool _Var6;
  char *pcVar7;
  
  uVar1 = MI->x86_prefix[0];
  if (uVar1 == 0xf3) {
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 != 0) {
      uVar2 = insns[uVar3].mapid;
      switch(uVar2) {
      case 0x1cf:
      case 0x1d3:
      case 0x1d5:
        break;
      case 0x1d0:
        if (uVar4 != 0x6ae) goto switchD_001a3281_caseD_1d1;
        break;
      case 0x1d1:
      case 0x1d2:
      case 0x1d4:
        goto switchD_001a3281_caseD_1d1;
      default:
        if (((((4 < uVar2 - 0xd9) || ((0x19U >> (uVar2 - 0xd9 & 0x1f) & 1) == 0)) &&
             (2 < uVar2 - 0x1ea)) && ((1 < uVar2 - 0x14a && (1 < uVar2 - 0x29d)))) &&
           (uVar2 != 0x148)) {
          if (uVar2 == 0x149) {
            if (uVar4 != 0x517) goto switchD_001a3281_caseD_1d1;
          }
          else if ((uVar2 != 0x29b) && ((uVar2 != 0x29c || (uVar4 != 0xab1))))
          goto switchD_001a3281_caseD_1d1;
        }
      }
      pcVar7 = "rep|";
      goto LAB_001a333b;
    }
switchD_001a3281_caseD_1d1:
    uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
    if (uVar3 != 0) {
      uVar2 = insns[uVar3].mapid;
      switch(uVar2) {
      case 0x60:
      case 0x62:
      case 100:
switchD_001a3332_caseD_60:
        pcVar7 = "repe|";
        goto LAB_001a333b;
      case 0x61:
        if (uVar4 == 0x233) goto switchD_001a3332_caseD_60;
        break;
      case 99:
        break;
      default:
        if (((uVar2 - 0x268 < 2) || (uVar2 == 0x266)) || ((uVar2 == 0x267 && (uVar4 == 0x9f2))))
        goto switchD_001a3332_caseD_60;
      }
    }
    MI->x86_prefix[0] = '\0';
    if (uVar4 == 0x6e9) {
      MCInst_setOpcode(MI,0x6f2);
      pcVar7 = "mulss\t";
LAB_001a33ad:
      SStream_concat(O,pcVar7);
      _Var6 = true;
      goto LAB_001a33be;
    }
  }
  else {
    if (uVar1 == 0xf2) {
      uVar4 = MCInst_getOpcode(MI);
      uVar3 = insn_find(insns,0x1726,uVar4,&MI->csh->insn_cache);
      if (uVar3 == 0) goto switchD_001a32b3_caseD_63;
      uVar2 = insns[uVar3].mapid;
      uVar5 = uVar2 - 0x266;
      if (uVar5 < 0x39) {
        if ((0x1e000000000000dU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          if ((ulong)uVar5 != 1) goto LAB_001a3133;
          if (uVar4 != 0x9f2) goto switchD_001a32b3_caseD_63;
        }
        goto switchD_001a32b3_caseD_60;
      }
LAB_001a3133:
      if ((uVar2 - 0x1cf < 0x1e) && ((0x38000053U >> (uVar2 - 0x1cf & 0x1f) & 1) != 0))
      goto switchD_001a32b3_caseD_60;
      switch(uVar2) {
      case 0x60:
      case 0x62:
      case 100:
        break;
      case 0x61:
        if (uVar4 != 0x233) goto switchD_001a32b3_caseD_63;
        break;
      case 99:
switchD_001a32b3_caseD_63:
        MI->x86_prefix[0] = '\0';
        if (uVar4 != 0x6e9) goto LAB_001a33bc;
        MCInst_setOpcode(MI,0x6ee);
        pcVar7 = "mulsd\t";
        goto LAB_001a33ad;
      default:
        if ((3 < uVar2 - 0x148) &&
           ((4 < uVar2 - 0xd9 || ((0x19U >> (uVar2 - 0xd9 & 0x1f) & 1) == 0))))
        goto switchD_001a32b3_caseD_63;
      }
switchD_001a32b3_caseD_60:
      pcVar7 = "repne|";
LAB_001a333b:
      _Var6 = false;
      SStream_concat(O,pcVar7);
      add_cx(MI);
      goto LAB_001a33be;
    }
    if (uVar1 == 0xf0) {
      _Var6 = false;
      SStream_concat(O,"lock|");
      goto LAB_001a33be;
    }
  }
LAB_001a33bc:
  _Var6 = false;
LAB_001a33be:
  if (MI->csh->detail != CS_OPT_OFF) {
    *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = *(undefined4 *)MI->x86_prefix;
  }
  return _Var6;
}

Assistant:

bool X86_lockrep(MCInst *MI, SStream *O)
{
	unsigned int opcode;
	bool res = false;

	switch(MI->x86_prefix[0]) {
		default:
			break;
		case 0xf0:
#ifndef CAPSTONE_DIET
			SStream_concat(O, "lock|");
#endif
			break;
		case 0xf2:	// repne
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_repne(MI->csh, opcode)) {
				SStream_concat(O, "repne|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSDrr);
					SStream_concat(O, "mulsd\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_repne(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSDrr);
			}
#endif
#endif
			break;

		case 0xf3:
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_rep(MI->csh, opcode)) {
				SStream_concat(O, "rep|");
				add_cx(MI);
			} else if (valid_repe(MI->csh, opcode)) {
				SStream_concat(O, "repe|");
				add_cx(MI);
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSSrr);
					SStream_concat(O, "mulss\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_rep(MI->csh, opcode) && !valid_repe(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSSrr);
			}
#endif
#endif
			break;
	}

	// copy normalized prefix[] back to x86.prefix[]
	if (MI->csh->detail)
		memcpy(MI->flat_insn->detail->x86.prefix, MI->x86_prefix, ARR_SIZE(MI->x86_prefix));

	return res;
}